

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprintdialog_unix.cpp
# Opt level: O0

int __thiscall QPrintDialogPrivate::init(QPrintDialogPrivate *this,EVP_PKEY_CTX *ctx)

{
  QRadioButton *pQVar1;
  QIcon *pQVar2;
  QLineEdit *pQVar3;
  QLatin1StringView latin1;
  QLatin1StringView latin1_00;
  QFlags<QDialogButtonBox::StandardButton> QVar4;
  QWidget *pQVar5;
  QUnixPrintWidget *pQVar6;
  QWidget *pQVar7;
  QDialogButtonBox *pQVar8;
  QPushButton *this_00;
  QString *pQVar9;
  QVBoxLayout *this_01;
  long in_FS_OFFSET;
  QVBoxLayout *lay;
  QPushButton *printButton;
  QPrintDialog *q;
  QWidget *in_stack_00000580;
  Ui_QPrintSettingsOutput *in_stack_00000588;
  int in_stack_fffffffffffffd48;
  int in_stack_fffffffffffffd4c;
  enum_type in_stack_fffffffffffffd50;
  enum_type in_stack_fffffffffffffd54;
  char *in_stack_fffffffffffffd58;
  QString *in_stack_fffffffffffffd60;
  ulong uVar10;
  undefined8 in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd8c;
  undefined4 in_stack_fffffffffffffda0;
  undefined4 in_stack_fffffffffffffda4;
  undefined4 uVar11;
  QPrinter *in_stack_fffffffffffffda8;
  QWidget *context;
  QUnixPrintWidget *in_stack_fffffffffffffdb0;
  QWidget *sender;
  ConnectionType type;
  QObject *this_02;
  Connection local_f0 [8];
  QPrintDialogPrivate *local_e8;
  Connection local_e0 [8];
  QPrintDialogPrivate *local_d8;
  Connection local_d0 [8];
  QObject local_c8 [8];
  QObject local_c0 [8];
  QObject local_b8 [8];
  QObject local_b0 [8];
  QObject local_a8 [12];
  undefined4 local_9c;
  undefined4 local_98;
  undefined4 local_94;
  undefined1 local_78 [24];
  undefined1 local_60 [24];
  QIcon local_48 [16];
  undefined1 local_38 [24];
  QIcon local_20 [20];
  uint local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = (QWidget *)q_func(this);
  pQVar6 = (QUnixPrintWidget *)operator_new(0x30);
  QAbstractPrintDialog::printer
            ((QAbstractPrintDialog *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50));
  QUnixPrintWidget::QUnixPrintWidget
            (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8,
             (QWidget *)CONCAT44(in_stack_fffffffffffffda4,in_stack_fffffffffffffda0));
  this->top = pQVar6;
  pQVar7 = (QWidget *)operator_new(0x28);
  memset(&local_c,0,4);
  QFlags<Qt::WindowType>::QFlags((QFlags<Qt::WindowType> *)0x16d9f2);
  QWidget::QWidget(pQVar7,pQVar5,(QFlags_conflict *)(ulong)local_c);
  this->bottom = pQVar7;
  Ui_QPrintSettingsOutput::setupUi(in_stack_00000588,in_stack_00000580);
  pQVar1 = (this->options).super_Ui_QPrintSettingsOutput.color;
  QSize::QSize((QSize *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
               in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48);
  QAbstractButton::setIconSize((QSize *)pQVar1);
  pQVar2 = (QIcon *)(this->options).super_Ui_QPrintSettingsOutput.color;
  Qt::Literals::StringLiterals::operator____L1
            (in_stack_fffffffffffffd58,CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50)
            );
  latin1.m_data._0_4_ = in_stack_fffffffffffffd88;
  latin1.m_size = in_stack_fffffffffffffd80;
  latin1.m_data._4_4_ = in_stack_fffffffffffffd8c;
  QString::QString(in_stack_fffffffffffffd60,latin1);
  QIcon::QIcon(local_20,(QString *)local_38);
  QAbstractButton::setIcon(pQVar2);
  QIcon::~QIcon(local_20);
  QString::~QString((QString *)0x16db14);
  pQVar1 = (this->options).super_Ui_QPrintSettingsOutput.grayscale;
  QSize::QSize((QSize *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
               in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48);
  QAbstractButton::setIconSize((QSize *)pQVar1);
  pQVar2 = (QIcon *)(this->options).super_Ui_QPrintSettingsOutput.grayscale;
  Qt::Literals::StringLiterals::operator____L1
            (in_stack_fffffffffffffd58,CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50)
            );
  latin1_00.m_data._0_4_ = in_stack_fffffffffffffd88;
  latin1_00.m_size = in_stack_fffffffffffffd80;
  latin1_00.m_data._4_4_ = in_stack_fffffffffffffd8c;
  QString::QString(in_stack_fffffffffffffd60,latin1_00);
  QIcon::QIcon(local_48,(QString *)local_60);
  QAbstractButton::setIcon(pQVar2);
  QIcon::~QIcon(local_48);
  QString::~QString((QString *)0x16dbed);
  pQVar1 = (this->options).super_Ui_QPrintSettingsOutput.pagesRadioButton;
  if (pQVar1 != (QRadioButton *)0x0) {
    (**(code **)(*(long *)pQVar1 + 0x20))();
  }
  pQVar3 = (this->options).super_Ui_QPrintSettingsOutput.pagesLineEdit;
  if (pQVar3 != (QLineEdit *)0x0) {
    (**(code **)(*(long *)pQVar3 + 0x20))();
  }
  (this->options).super_Ui_QPrintSettingsOutput.pagesRadioButton = (QRadioButton *)0x0;
  (this->options).super_Ui_QPrintSettingsOutput.pagesLineEdit = (QLineEdit *)0x0;
  QUnixPrintWidgetPrivate::setOptionsPane
            ((QUnixPrintWidgetPrivate *)
             CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
             (QPrintDialogPrivate *)CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48));
  uVar10 = 0x28;
  pQVar8 = (QDialogButtonBox *)operator_new(0x28);
  QVar4 = operator|(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50);
  uVar11 = 1;
  QDialogButtonBox::QDialogButtonBox
            (pQVar8,(QFlags_conflict *)
                    (ulong)(uint)QVar4.
                                 super_QFlagsStorageHelper<QDialogButtonBox::StandardButton,_4>.
                                 super_QFlagsStorage<QDialogButtonBox::StandardButton>.i,Horizontal,
             pQVar5);
  this->buttons = pQVar8;
  this_00 = (QPushButton *)operator_new(uVar10);
  QPrintDialog::tr((char *)pQVar8,
                   (char *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                   in_stack_fffffffffffffd4c);
  QPushButton::QPushButton(this_00,(QString *)local_78,(QWidget *)this->buttons);
  this->collapseButton = this_00;
  QString::~QString((QString *)0x16dd52);
  QDialogButtonBox::addButton((QAbstractButton *)this->buttons,(ButtonRole)this->collapseButton);
  (**(code **)(*(long *)this->bottom + 0x68))(this->bottom,0);
  pQVar9 = (QString *)QDialogButtonBox::button((StandardButton)this->buttons);
  QPrintDialog::tr((char *)pQVar8,
                   (char *)CONCAT44(in_stack_fffffffffffffd54,in_stack_fffffffffffffd50),
                   in_stack_fffffffffffffd4c);
  QAbstractButton::setText(pQVar9);
  QString::~QString((QString *)0x16ddf9);
  QPushButton::setDefault(SUB81(pQVar9,0));
  this_01 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(this_01,pQVar5);
  pQVar6 = this->top;
  local_94 = 0;
  context = (QWidget *)this_01;
  sender = (QWidget *)this_01;
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x16de6f);
  QBoxLayout::addWidget(sender,(int)pQVar6,(QFlags_conflict *)0x0);
  pQVar7 = this->bottom;
  local_98 = 0;
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x16dec8);
  QBoxLayout::addWidget((QWidget *)this_01,(int)pQVar7,(QFlags_conflict *)0x0);
  pQVar8 = this->buttons;
  local_9c = 0;
  QFlags<Qt::AlignmentFlag>::QFlags((QFlags<Qt::AlignmentFlag> *)0x16df27);
  QBoxLayout::addWidget((QWidget *)this_01,(int)pQVar8,(QFlags_conflict *)0x0);
  QObject::connect(local_a8,(char *)this->buttons,(QObject *)"2accepted()",(char *)pQVar5,0x18dbbf);
  QMetaObject::Connection::~Connection((Connection *)local_a8);
  QObject::connect(local_b0,(char *)this->buttons,(QObject *)"2rejected()",(char *)pQVar5,0x18cf2a);
  QMetaObject::Connection::~Connection((Connection *)local_b0);
  this_02 = local_b8;
  QObject::connect(this_02,(char *)(this->options).super_Ui_QPrintSettingsOutput.printSelection,
                   (QObject *)"2toggled(bool)",(char *)pQVar5,0x18dbe0);
  QMetaObject::Connection::~Connection((Connection *)this_02);
  type = (ConnectionType)this_02;
  QObject::connect(local_c0,(char *)(this->options).super_Ui_QPrintSettingsOutput.printCurrentPage,
                   (QObject *)"2toggled(bool)",(char *)pQVar5,0x18dbe0);
  QMetaObject::Connection::~Connection((Connection *)local_c0);
  QObject::connect(local_c8,(char *)this->collapseButton,(QObject *)"2released()",(char *)pQVar5,
                   0x18dc09);
  QMetaObject::Connection::~Connection((Connection *)local_c8);
  local_d8 = this;
  QObject::connect<void(QAbstractButton::*)(bool),QPrintDialogPrivate::init()::__0>
            ((Object *)sender,(offset_in_QAbstractButton_to_subr)this_01,(ContextType *)context,
             (anon_class_8_1_8991fb9c_for_o *)CONCAT44(uVar11,in_stack_fffffffffffffda0),type);
  QMetaObject::Connection::~Connection(local_d0);
  local_e8 = this;
  QObject::connect<void(QAbstractButton::*)(bool),QPrintDialogPrivate::init()::__1>
            ((Object *)sender,(offset_in_QAbstractButton_to_subr)this_01,(ContextType *)context,
             (anon_class_8_1_8991fb9c_for_o *)CONCAT44(uVar11,in_stack_fffffffffffffda0),type);
  QMetaObject::Connection::~Connection(local_e0);
  QObject::connect<void(QAbstractButton::*)(bool),QPrintDialogPrivate::init()::__2>
            ((Object *)sender,(offset_in_QAbstractButton_to_subr)this_01,(ContextType *)context,
             (anon_class_8_1_8991fb9c_for_o *)CONCAT44(uVar11,in_stack_fffffffffffffda0),type);
  QMetaObject::Connection::~Connection(local_f0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QPrintDialogPrivate::init()
{
    Q_Q(QPrintDialog);

    top = new QUnixPrintWidget(q->printer(), q);
    bottom = new QWidget(q);
    options.setupUi(bottom);
    options.color->setIconSize(QSize(32, 32));
    options.color->setIcon(QIcon(":/qt-project.org/dialogs/qprintdialog/images/status-color.png"_L1));
    options.grayscale->setIconSize(QSize(32, 32));
    options.grayscale->setIcon(QIcon(":/qt-project.org/dialogs/qprintdialog/images/status-gray-scale.png"_L1));

#if QT_CONFIG(cups)
    // Add Page Set widget if CUPS is available
    options.pageSetCombo->addItem(tr("All Pages"), QVariant::fromValue(QCUPSSupport::AllPages));
    options.pageSetCombo->addItem(tr("Odd Pages"), QVariant::fromValue(QCUPSSupport::OddPages));
    options.pageSetCombo->addItem(tr("Even Pages"), QVariant::fromValue(QCUPSSupport::EvenPages));
#else
    delete options.pagesRadioButton;
    delete options.pagesLineEdit;
    options.pagesRadioButton = nullptr;
    options.pagesLineEdit = nullptr;
#endif

    top->d->setOptionsPane(this);

    buttons = new QDialogButtonBox(QDialogButtonBox::Ok | QDialogButtonBox::Cancel, Qt::Horizontal, q);
    collapseButton = new QPushButton(QPrintDialog::tr("&Options >>"), buttons);
    buttons->addButton(collapseButton, QDialogButtonBox::ResetRole);
    bottom->setVisible(false);

    QPushButton *printButton = buttons->button(QDialogButtonBox::Ok);
    printButton->setText(QPrintDialog::tr("&Print"));
    printButton->setDefault(true);

    QVBoxLayout *lay = new QVBoxLayout(q);
    lay->addWidget(top);
    lay->addWidget(bottom);
    lay->addWidget(buttons);

#if !QT_CONFIG(messagebox)
    QObject::connect(buttons, SIGNAL(accepted()), q, SLOT(accept()));
#else
    QObject::connect(buttons, SIGNAL(accepted()), q, SLOT(_q_checkFields()));
#endif
    QObject::connect(buttons, SIGNAL(rejected()), q, SLOT(reject()));

    QObject::connect(options.printSelection, SIGNAL(toggled(bool)),
                     q, SLOT(_q_togglePageSetCombo(bool)));

    QObject::connect(options.printCurrentPage, SIGNAL(toggled(bool)),
                     q, SLOT(_q_togglePageSetCombo(bool)));

    QObject::connect(collapseButton, SIGNAL(released()), q, SLOT(_q_collapseOrExpandDialog()));

    QObject::connect(options.noDuplex, &QAbstractButton::clicked, q, [this] { setExplicitDuplexMode(QPrint::DuplexNone); });
    QObject::connect(options.duplexLong, &QAbstractButton::clicked, q, [this] { setExplicitDuplexMode(QPrint::DuplexLongSide); });
    QObject::connect(options.duplexShort, &QAbstractButton::clicked, q, [this] { setExplicitDuplexMode(QPrint::DuplexShortSide); });

#if QT_CONFIG(cups)
    QObject::connect(options.noDuplex, &QAbstractButton::toggled, q, [this] { updatePpdDuplexOption(options.noDuplex); });
    QObject::connect(options.duplexLong, &QAbstractButton::toggled, q, [this] { updatePpdDuplexOption(options.duplexLong); });
    QObject::connect(options.duplexShort, &QAbstractButton::toggled, q, [this] { updatePpdDuplexOption(options.duplexShort); });
#endif
}